

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp11_define_array.hpp
# Opt level: O0

void msgpack::v1::type::
     define_array_imp<std::tuple<int_const&,std::__cxx11::string_const&,int_const&>,3ul>::
     pack<msgpack::v1::packer<msgpack::v1::sbuffer>>
               (packer<msgpack::v1::sbuffer> *pk,
               tuple<const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
               *t)

{
  packer<msgpack::v1::sbuffer> *in_RSI;
  int *in_RDI;
  tuple<const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
  *in_stack_ffffffffffffffe8;
  
  define_array_imp<std::tuple<int_const&,std::__cxx11::string_const&,int_const&>,2ul>::
  pack<msgpack::v1::packer<msgpack::v1::sbuffer>>(in_RSI,in_stack_ffffffffffffffe8);
  std::get<2ul,int_const&,std::__cxx11::string_const&,int_const&>
            ((tuple<const_int_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_int_&>
              *)0x2a5520);
  packer<msgpack::v1::sbuffer>::pack<int>(in_RSI,in_RDI);
  return;
}

Assistant:

static void pack(Packer& pk, Tuple const& t) {
        define_array_imp<Tuple, N-1>::pack(pk, t);
        pk.pack(std::get<N-1>(t));
    }